

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomDateTime::write(DomDateTime *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  char16_t *pcVar2;
  uint uVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar5._4_4_ = in_register_00000034;
  aVar5._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"datetime";
    local_50.size = 8;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar6.m_size = (size_t)local_50.ptr;
  QVar6.field_0.m_data = aVar5.m_data;
  QXmlStreamWriter::writeStartElement(QVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  uVar3 = this->m_children;
  if ((uVar3 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"hour",4);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_hour);
    QVar7.m_size = (size_t)pcVar2;
    QVar7.field_0.m_data = aVar5.m_data;
    QVar13.m_size = (size_t)local_80.ptr;
    QVar13.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar7,QVar13);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"minute",6);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_minute);
    QVar8.m_size = (size_t)pcVar2;
    QVar8.field_0.m_data = aVar5.m_data;
    QVar14.m_size = (size_t)local_80.ptr;
    QVar14.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar8,QVar14);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"second",6);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_second);
    QVar9.m_size = (size_t)pcVar2;
    QVar9.field_0.m_data = aVar5.m_data;
    QVar15.m_size = (size_t)local_80.ptr;
    QVar15.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar9,QVar15);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 8) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"year",4);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_year);
    QVar10.m_size = (size_t)pcVar2;
    QVar10.field_0.m_data = aVar5.m_data;
    QVar16.m_size = (size_t)local_80.ptr;
    QVar16.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar10,QVar16);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x10) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"month",5);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_month);
    QVar11.m_size = (size_t)pcVar2;
    QVar11.field_0.m_data = aVar5.m_data;
    QVar17.m_size = (size_t)local_80.ptr;
    QVar17.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar11,QVar17);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x20) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"day",3);
    pcVar2 = local_50.ptr;
    aVar4.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_day);
    QVar12.m_size = (size_t)pcVar2;
    QVar12.field_0.m_data = aVar5.m_data;
    QVar18.m_size = (size_t)local_80.ptr;
    QVar18.field_0.m_data = aVar4.m_data;
    QXmlStreamWriter::writeTextElement(QVar12,QVar18);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomDateTime::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("datetime") : tagName.toLower());

    if (m_children & Hour)
        writer.writeTextElement(u"hour"_s, QString::number(m_hour));

    if (m_children & Minute)
        writer.writeTextElement(u"minute"_s, QString::number(m_minute));

    if (m_children & Second)
        writer.writeTextElement(u"second"_s, QString::number(m_second));

    if (m_children & Year)
        writer.writeTextElement(u"year"_s, QString::number(m_year));

    if (m_children & Month)
        writer.writeTextElement(u"month"_s, QString::number(m_month));

    if (m_children & Day)
        writer.writeTextElement(u"day"_s, QString::number(m_day));

    writer.writeEndElement();
}